

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::GetBooleanValueWithAutoDereference
          (cmConditionEvaluator *this,cmExpandedCommandArgument *newArg,string *errorString,
          MessageType *status,bool oneArg)

{
  PolicyStatus PVar1;
  bool bVar2;
  bool bVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->Policy12Status == OLD) {
    bVar2 = GetBooleanValueOld(this,newArg,oneArg);
    return bVar2;
  }
  if (this->Policy12Status == NEW) {
    bVar2 = GetBooleanValue(this,newArg);
    return bVar2;
  }
  bVar2 = GetBooleanValue(this,newArg);
  bVar3 = GetBooleanValueOld(this,newArg,oneArg);
  if (bVar2 == bVar3) {
    return bVar2;
  }
  PVar1 = this->Policy12Status;
  if (1 < PVar1 - REQUIRED_IF_USED) {
    if (PVar1 == OLD) {
      return bVar3;
    }
    if (PVar1 != WARN) {
      return bVar2;
    }
    std::operator+(&local_50,"An argument named \"",&newArg->Value);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a0 = *puVar6;
      lStack_98 = plVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar6;
      local_b0 = (ulong *)*plVar4;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_70,(cmPolicies *)0xc,(PolicyID)local_a8);
    uVar7 = 0xf;
    if (local_b0 != &local_a0) {
      uVar7 = local_a0;
    }
    if (uVar7 < local_70._M_string_length + local_a8) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar8 = local_70.field_2._M_allocated_capacity;
      }
      if (local_70._M_string_length + local_a8 <= (ulong)uVar8) {
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
        goto LAB_002ae4fa;
      }
    }
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
LAB_002ae4fa:
    local_90 = &local_80;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_80 = *plVar4;
      uStack_78 = puVar5[3];
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*puVar5;
    }
    local_88 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    std::__cxx11::string::operator=((string *)errorString,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    *status = AUTHOR_WARNING;
    return bVar3;
  }
  std::operator+(&local_50,"An argument named \"",&newArg->Value);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_a0 = *puVar6;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar6;
    local_b0 = (ulong *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_70,(cmPolicies *)0xc,(PolicyID)local_a8);
  uVar7 = 0xf;
  if (local_b0 != &local_a0) {
    uVar7 = local_a0;
  }
  if (uVar7 < local_70._M_string_length + local_a8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar8 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_a8 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
      goto LAB_002ae3a2;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
LAB_002ae3a2:
  local_90 = &local_80;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_80 = *plVar4;
    uStack_78 = puVar5[3];
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*puVar5;
  }
  local_88 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  std::__cxx11::string::operator=((string *)errorString,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *status = FATAL_ERROR;
  return bVar2;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueWithAutoDereference(
  cmExpandedCommandArgument &newArg,
  std::string &errorString,
  cmake::MessageType &status,
  bool oneArg) const
{
  // Use the policy if it is set.
  if (this->Policy12Status == cmPolicies::NEW)
    {
    return GetBooleanValue(newArg);
    }
  else if (this->Policy12Status == cmPolicies::OLD)
    {
    return GetBooleanValueOld(newArg, oneArg);
    }

  // Check policy only if old and new results differ.
  bool newResult = this->GetBooleanValue(newArg);
  bool oldResult = this->GetBooleanValueOld(newArg, oneArg);
  if(newResult != oldResult)
    {
    switch(this->Policy12Status)
      {
      case cmPolicies::WARN:
        {
        errorString = "An argument named \"" + newArg.GetValue()
          + "\" appears in a conditional statement.  "
          + cmPolicies::GetPolicyWarning(cmPolicies::CMP0012);
        status = cmake::AUTHOR_WARNING;
        }
      case cmPolicies::OLD:
        return oldResult;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        {
        errorString = "An argument named \"" + newArg.GetValue()
          + "\" appears in a conditional statement.  "
          + cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0012);
        status = cmake::FATAL_ERROR;
        }
      case cmPolicies::NEW:
        break;
      }
    }
  return newResult;
}